

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O2

uint8_t * pci_map_resource(char *pci_addr)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uStackY_12c0;
  stat stat;
  char buf [512];
  char path [4096];
  
  snprintf(path,0x1000,"/sys/bus/pci/devices/%s/resource0",pci_addr);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Mapping PCI resource at %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x2c,
          "pci_map_resource");
  remove_driver(pci_addr);
  enable_dma(pci_addr);
  iVar1 = open(path,2);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    __xpg_strerror_r(iVar1,buf,0x200);
    pcVar5 = "open pci resource";
    uStackY_12c0 = 0x2f;
  }
  else {
    iVar2 = fstat(iVar1,(stat *)&stat);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      __xpg_strerror_r(iVar1,buf,0x200);
      pcVar5 = "stat pci resource";
      uStackY_12c0 = 0x31;
    }
    else {
      puVar3 = (uint8_t *)mmap((void *)0x0,stat.st_size,3,1,iVar1,0);
      if (puVar3 == (uint8_t *)0xffffffffffffffff) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        __xpg_strerror_r(iVar1,buf,0x200);
        pcVar5 = "mmap pci resource";
        uStackY_12c0 = 0x32;
      }
      else {
        iVar1 = close(iVar1);
        if (iVar1 != -1) {
          return puVar3;
        }
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        __xpg_strerror_r(iVar1,buf,0x200);
        pcVar5 = "close pci resource";
        uStackY_12c0 = 0x33;
      }
    }
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",uStackY_12c0,
          "pci_map_resource",pcVar5,buf);
  exit(iVar1);
}

Assistant:

uint8_t* pci_map_resource(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/resource0", pci_addr);
	debug("Mapping PCI resource at %s", path);
	remove_driver(pci_addr);
	enable_dma(pci_addr);
	int fd = check_err(open(path, O_RDWR), "open pci resource");
	struct stat stat;
	check_err(fstat(fd, &stat), "stat pci resource");
	uint8_t* hw = (uint8_t*) check_err(mmap(NULL, stat.st_size, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0), "mmap pci resource");
	check_err(close(fd), "close pci resource");
	return hw;
}